

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

int __thiscall QMetaMethod::revision(QMetaMethod *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  if ((this->mobj != (QMetaObject *)0x0) && (puVar2 = (this->data).d, (puVar2[4] & 0x80) != 0)) {
    puVar3 = (this->mobj->d).data;
    if ((int)*puVar3 < 0xd) {
      uVar5 = puVar3[4];
      uVar1 = puVar3[5];
      iVar4 = anon_unknown.dwarf_641be2::QMetaMethodPrivate::ownMethodIndex
                        ((QMetaMethodPrivate *)this);
      uVar6 = (ulong)(int)(iVar4 + uVar5 * 6 + uVar1);
    }
    else {
      uVar6 = (ulong)(puVar2[2] - 1);
    }
    uVar5 = puVar3[uVar6];
  }
  return uVar5;
}

Assistant:

int QMetaMethod::revision() const
{
    if (!mobj)
        return 0;
    if ((data.flags() & MethodRevisioned) == 0)
        return 0;
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    if (priv(mobj->d.data)->revision < 13) {
        // revision number located elsewhere
        int offset = priv(mobj->d.data)->methodData
                     + priv(mobj->d.data)->methodCount * Data::Size
                     + QMetaMethodPrivate::get(this)->ownMethodIndex();
        return mobj->d.data[offset];
    }
#endif

    return mobj->d.data[data.parameters() - 1];
}